

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurrentGenerator.cpp
# Opt level: O3

void __thiscall CurrentGenerator::CurrentGenerator(CurrentGenerator *this)

{
  double dVar1;
  uint uVar2;
  CurrentGenerator_param *pCVar3;
  Clock *pCVar4;
  Logging *pLVar5;
  uint uVar6;
  
  (this->super_Neuron)._vptr_Neuron = (_func_int **)&PTR_update_00126ae8;
  pCVar3 = (CurrentGenerator_param *)operator_new(0x28);
  pCVar3->I = 10.0;
  pCVar3->noiseMean = 0.0;
  pCVar3->noiseStd = 1.0;
  pCVar3->noiseOn = 0.0;
  pCVar3->ac_hz = 0.0;
  this->param = pCVar3;
  (this->generator)._M_x = 1;
  *(undefined4 *)&(this->distribution)._M_param._M_mean = 0;
  *(undefined4 *)((long)&(this->distribution)._M_param._M_mean + 4) = 0;
  *(undefined4 *)&(this->distribution)._M_param._M_stddev = 0;
  *(undefined4 *)((long)&(this->distribution)._M_param._M_stddev + 4) = 0x3ff00000;
  (this->distribution)._M_saved = 0.0;
  (this->distribution)._M_saved_available = false;
  pCVar4 = Clock::getInstance();
  this->clock = pCVar4;
  pLVar5 = Logging::getInstance();
  (this->super_Neuron).logger = pLVar5;
  uVar2 = std::chrono::_V2::system_clock::now();
  uVar6 = uVar2 / 0x7fffffff << 0x1f | uVar2 / 0x7fffffff;
  (this->generator)._M_x = (ulong)(uVar6 + uVar2 + (uint)(uVar2 + uVar6 == 0));
  dVar1 = this->param->noiseStd;
  (this->distribution)._M_param._M_mean = this->param->noiseMean;
  (this->distribution)._M_param._M_stddev = dVar1;
  (this->distribution)._M_saved = 0.0;
  (this->distribution)._M_saved_available = false;
  return;
}

Assistant:

CurrentGenerator::CurrentGenerator() : param(new CurrentGenerator_param) { 
    clock = Clock::getInstance();
    initialize();
    unsigned seed = std::chrono::system_clock::now().time_since_epoch().count();
    generator = std::default_random_engine(seed);
    distribution = std::normal_distribution<double>(param->noiseMean, param->noiseStd);
}